

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

void If_ObjPrint(If_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (pObj == (If_Obj_t *)0x0) {
    printf("Object is NULL.");
    return;
  }
  printf("Obj %4d : ",(ulong)(uint)pObj->Id);
  uVar1 = *(uint *)pObj;
  uVar2 = uVar1 & 0xf;
  if (uVar2 == 3) {
    pcVar3 = "\'";
    if ((uVar1 & 0x10) == 0) {
      pcVar3 = " ";
    }
    printf("PO( %4d%s )",(ulong)(uint)pObj->pFanin0->Id,pcVar3);
  }
  else {
    if (uVar2 == 2) {
      pcVar3 = "PI";
    }
    else {
      if (uVar2 != 1) {
        pcVar4 = "\'";
        pcVar3 = "\'";
        if ((uVar1 & 0x10) == 0) {
          pcVar3 = " ";
        }
        if ((uVar1 & 0x20) == 0) {
          pcVar4 = " ";
        }
        printf("AND( %4d%s, %4d%s )",(ulong)(uint)pObj->pFanin0->Id,pcVar3,
               (ulong)(uint)pObj->pFanin1->Id,pcVar4);
        goto LAB_0039a909;
      }
      pcVar3 = "constant 1";
    }
    printf(pcVar3);
  }
LAB_0039a909:
  printf(" (refs = %3d)",(ulong)(uint)pObj->nVisitsCopy);
  putchar(10);
  return;
}

Assistant:

void If_ObjPrint( If_Obj_t * pObj )
{
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    printf( "Obj %4d : ", If_ObjId(pObj) );
    if ( If_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( If_ObjIsCi(pObj) )
        printf( "PI" );
    else if ( If_ObjIsCo(pObj) )
        printf( "PO( %4d%s )", If_ObjId(If_ObjFanin0(pObj)), (If_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            If_ObjId(If_ObjFanin0(pObj)), (If_ObjFaninC0(pObj)? "\'" : " "), 
            If_ObjId(If_ObjFanin1(pObj)), (If_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", pObj->nVisitsCopy );
    printf( "\n" );
}